

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simplewidgets.cpp
# Opt level: O0

QString * __thiscall QAccessibleButton::text(QAccessibleButton *this,Text t)

{
  bool bVar1;
  QPushButton *pQVar2;
  int in_EDX;
  QWidget *in_RSI;
  QPushButton *in_RDI;
  long in_FS_OFFSET;
  QPushButton *pb;
  QString *str;
  QPushButton *this_00;
  Text t_00;
  QAccessibleWidget *in_stack_ffffffffffffff48;
  QKeySequence local_28 [8];
  undefined1 local_20 [24];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  *(undefined1 **)&(in_RDI->super_QAbstractButton).super_QWidget.super_QPaintDevice =
       &DAT_aaaaaaaaaaaaaaaa;
  *(Data **)&(in_RDI->super_QAbstractButton).super_QWidget = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  *(undefined1 **)&(in_RDI->super_QAbstractButton).super_QWidget.field_0x8 = &DAT_aaaaaaaaaaaaaaaa;
  this_00 = in_RDI;
  pQVar2 = in_RDI;
  QString::QString((QString *)0x7edcb2);
  t_00 = (Text)((ulong)pQVar2 >> 0x20);
  if (in_EDX == 0) {
    QAccessibleWidget::widget((QAccessibleWidget *)0x7eddd8);
    QWidget::accessibleName(in_RSI);
    QString::operator=((QString *)this_00,(QString *)in_RDI);
    QString::~QString((QString *)0x7ede06);
    bVar1 = QString::isEmpty((QString *)0x7ede0f);
    if (bVar1) {
      button((QAccessibleButton *)0x7ede1f);
      QAbstractButton::text((QAbstractButton *)in_RSI);
      qt_accStripAmp((QString *)in_stack_ffffffffffffff48);
      QString::operator=((QString *)this_00,(QString *)in_RDI);
      QString::~QString((QString *)0x7ede53);
      QString::~QString((QString *)0x7ede5d);
    }
  }
  else if (in_EDX == 4) {
    (**(code **)(*(long *)in_RSI + 0x18))();
    pQVar2 = qobject_cast<QPushButton*>((QObject *)0x7edce6);
    if ((pQVar2 != (QPushButton *)0x0) && (bVar1 = QPushButton::isDefault(this_00), bVar1)) {
      QKeySequence::QKeySequence(local_28,0x1000005,0,0,0);
      QKeySequence::toString((SequenceFormat)local_20);
      QString::operator=((QString *)this_00,(QString *)in_RDI);
      QString::~QString((QString *)0x7edd53);
      QKeySequence::~QKeySequence(local_28);
    }
    bVar1 = QString::isEmpty((QString *)0x7edd69);
    if (bVar1) {
      button((QAccessibleButton *)0x7edd79);
      QAbstractButton::text((QAbstractButton *)in_RSI);
      qt_accHotKey((QString *)in_RSI);
      QString::operator=((QString *)this_00,(QString *)in_RDI);
      QString::~QString((QString *)0x7eddbc);
      QString::~QString((QString *)0x7eddc9);
    }
  }
  bVar1 = QString::isEmpty((QString *)0x7ede6a);
  if (bVar1) {
    QAccessibleWidget::text(in_stack_ffffffffffffff48,t_00);
    QString::operator=((QString *)this_00,(QString *)in_RDI);
    QString::~QString((QString *)0x7ede9b);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (QString *)this_00;
  }
  __stack_chk_fail();
}

Assistant:

QString QAccessibleButton::text(QAccessible::Text t) const
{
    QString str;
    switch (t) {
    case QAccessible::Accelerator:
    {
#if QT_CONFIG(shortcut) && QT_CONFIG(pushbutton)
        QPushButton *pb = qobject_cast<QPushButton*>(object());
        if (pb && pb->isDefault())
            str = QKeySequence(Qt::Key_Enter).toString(QKeySequence::NativeText);
#endif
        if (str.isEmpty())
            str = qt_accHotKey(button()->text());
    }
         break;
    case QAccessible::Name:
        str = widget()->accessibleName();
        if (str.isEmpty())
            str = qt_accStripAmp(button()->text());
        break;
    default:
        break;
    }
    if (str.isEmpty())
        str = QAccessibleWidget::text(t);
    return str;
}